

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O0

int archive_read_next_header(archive *a,archive_entry **entry)

{
  int iVar1;
  archive_entry **entry_local;
  archive *a_local;
  
  iVar1 = (*a->vtable->archive_read_next_header)(a,entry);
  return iVar1;
}

Assistant:

int
_archive_read_next_header(struct archive *_a, struct archive_entry **entryp)
{
	int ret;
	struct archive_read *a = (struct archive_read *)_a;
	*entryp = NULL;
	ret = _archive_read_next_header2(_a, a->entry);
	*entryp = a->entry;
	return ret;
}